

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroMapEntriesStringValuePopulatedInGenCode_Test::
NoFieldPresenceTest_TestNonZeroMapEntriesStringValuePopulatedInGenCode_Test
          (NoFieldPresenceTest_TestNonZeroMapEntriesStringValuePopulatedInGenCode_Test *this)

{
  NoFieldPresenceTest_TestNonZeroMapEntriesStringValuePopulatedInGenCode_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__NoFieldPresenceTest_TestNonZeroMapEntriesStringValuePopulatedInGenCode_Test_029de028;
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroMapEntriesStringValuePopulatedInGenCode) {
  // Set nonzero values for key-value pairs and test that.
  TestAllMapTypes message;
  (*message.mutable_map_int32_bytes())[9] = "hello";

  EXPECT_EQ(1, message.map_int32_bytes().size());
  // Keys can be found.
  EXPECT_TRUE(message.map_int32_bytes().contains(9));
  // Values are counted properly.
  EXPECT_EQ(1, message.map_int32_bytes().count(9));
  // Value can be retrieved.
  EXPECT_EQ("hello", message.map_int32_bytes().at(9));

  // Note that `has_foo` APIs are not available for implicit presence fields.
  // So there is no way to check has_field behaviour in gencode.
}